

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

string * __thiscall CTxOut::ToString_abi_cxx11_(CTxOut *this)

{
  long lVar1;
  size_type *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  size_type __n;
  undefined1 *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long *in_stack_ffffffffffffff78;
  long *in_stack_ffffffffffffff80;
  undefined1 local_48 [24];
  Span<const_unsigned_char> in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = *in_RSI;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  Span<const_unsigned_char>::Span<CScript>
            ((Span<const_unsigned_char> *)in_RDI,(CScript *)in_RDI,in_stack_ffffffffffffff48);
  __pos = local_48;
  HexStr_abi_cxx11_(in_stack_ffffffffffffffd0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (this_00,(size_type)__pos,__n);
  tinyformat::format<long,long,std::__cxx11::string>
            ((char *)in_RSI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,this_00);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string CTxOut::ToString() const
{
    return strprintf("CTxOut(nValue=%d.%08d, scriptPubKey=%s)", nValue / COIN, nValue % COIN, HexStr(scriptPubKey).substr(0, 30));
}